

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  undefined8 *in_RSI;
  int in_EDI;
  int c;
  FILE *src_file;
  int marker;
  uint comment_length;
  FILE *comment_file;
  char *comment_arg;
  int keep_COM;
  char *arg;
  int argn;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  FILE *__stream;
  FILE *pFVar5;
  char *in_stack_ffffffffffffffa8;
  uint local_3c;
  FILE *local_38;
  char *local_30;
  int local_14;
  
  local_30 = (char *)0x0;
  local_38 = (FILE *)0x0;
  local_3c = 0;
  progname = (char *)*in_RSI;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "wrjpgcom";
  }
  local_14 = 1;
  do {
    if ((in_EDI <= local_14) || (*(char *)in_RSI[local_14] != '-')) {
      if ((local_30 != (char *)0x0) && (local_38 != (FILE *)0x0)) {
        usage();
      }
      iVar1 = (int)in_stack_ffffffffffffffa0;
      if (((local_30 == (char *)0x0) && (local_38 == (FILE *)0x0)) && (in_EDI <= local_14)) {
        usage();
      }
      if (local_14 < in_EDI) {
        infile = (FILE *)fopen((char *)in_RSI[local_14],"rb");
        if ((FILE *)infile == (FILE *)0x0) {
          fprintf(_stderr,"%s: can\'t open %s\n",progname,in_RSI[local_14]);
          exit(1);
        }
      }
      else {
        infile = (FILE *)_stdin;
      }
      if (local_14 < in_EDI + -1) {
        fprintf(_stderr,"%s: only one input file\n",progname);
        usage();
      }
      outfile = _stdout;
      if (local_30 == (char *)0x0) {
        pvVar4 = malloc(65000);
        if (pvVar4 == (void *)0x0) {
          fprintf(_stderr,"%s\n","Insufficient memory");
          exit(1);
        }
        local_3c = 0;
        pFVar5 = _stdin;
        __stream = _stdin;
        if (local_38 != (FILE *)0x0) {
          pFVar5 = local_38;
          __stream = local_38;
        }
        while( true ) {
          iVar2 = getc(__stream);
          iVar1 = (int)pFVar5;
          if (iVar2 == -1) break;
          if (64999 < local_3c) {
            fprintf(_stderr,"Comment text may not exceed %u bytes\n",65000);
            exit(1);
          }
          *(char *)((long)pvVar4 + (ulong)local_3c) = (char)iVar2;
          local_3c = local_3c + 1;
        }
        if (local_38 != (FILE *)0x0) {
          fclose(local_38);
        }
      }
      scan_JPEG_header(iVar1);
      if (local_3c != 0) {
        write_marker(0);
        write_2_bytes(0);
        for (; local_3c != 0; local_3c = local_3c - 1) {
          write_1_byte(0);
        }
      }
      write_marker(0);
      copy_rest_of_file();
      exit(0);
    }
    iVar1 = keymatch(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (iVar1 == 0) {
      iVar1 = keymatch(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c
                      );
      if (iVar1 == 0) {
        iVar1 = keymatch(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c);
        if (iVar1 == 0) {
          usage();
        }
        else {
          local_14 = local_14 + 1;
          if (in_EDI <= local_14) {
            usage();
          }
          local_30 = (char *)in_RSI[local_14];
          if (*local_30 == '\"') {
            local_30 = (char *)malloc(65000);
            if (local_30 == (char *)0x0) {
              fprintf(_stderr,"%s\n","Insufficient memory");
              exit(1);
            }
            sVar3 = strlen((char *)in_RSI[local_14]);
            if (64999 < sVar3 + 2) {
              fprintf(_stderr,"Comment text may not exceed %u bytes\n",65000);
              exit(1);
            }
            strcpy(local_30,(char *)(in_RSI[local_14] + 1));
            while( true ) {
              sVar3 = strlen(local_30);
              iVar1 = (int)sVar3;
              if ((iVar1 != 0) && (local_30[iVar1 - 1] == '\"')) break;
              local_14 = local_14 + 1;
              if (in_EDI <= local_14) {
                fprintf(_stderr,"%s\n","Missing ending quote mark");
                exit(1);
              }
              in_stack_ffffffffffffffa8 = (char *)strlen(local_30);
              sVar3 = strlen((char *)in_RSI[local_14]);
              if ((char *)0xfde7 < in_stack_ffffffffffffffa8 + sVar3 + 2) {
                fprintf(_stderr,"Comment text may not exceed %u bytes\n",65000);
                exit(1);
              }
              strcat(local_30," ");
              strcat(local_30,(char *)in_RSI[local_14]);
            }
            local_30[iVar1 - 1] = '\0';
          }
          else {
            sVar3 = strlen((char *)in_RSI[local_14]);
            if (64999 < sVar3) {
              fprintf(_stderr,"Comment text may not exceed %u bytes\n",65000);
              exit(1);
            }
          }
          sVar3 = strlen(local_30);
          local_3c = (uint)sVar3;
        }
      }
      else {
        local_14 = local_14 + 1;
        if (in_EDI <= local_14) {
          usage();
        }
        local_38 = fopen((char *)in_RSI[local_14],"r");
        if (local_38 == (FILE *)0x0) {
          fprintf(_stderr,"%s: can\'t open %s\n",progname,in_RSI[local_14]);
          exit(1);
        }
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int
main(int argc, char **argv)
{
  int argn;
  char *arg;
  int keep_COM = 1;
  char *comment_arg = NULL;
  FILE *comment_file = NULL;
  unsigned int comment_length = 0;
  int marker;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "wrjpgcom";      /* in case C library doesn't provide it */

  /* Parse switches, if any */
  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (arg[0] != '-')
      break;                    /* not switch, must be file name */
    arg++;                      /* advance over '-' */
    if (keymatch(arg, "replace", 1)) {
      keep_COM = 0;
    } else if (keymatch(arg, "cfile", 2)) {
      if (++argn >= argc) usage();
      if ((comment_file = fopen(argv[argn], "r")) == NULL) {
        fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
    } else if (keymatch(arg, "comment", 1)) {
      if (++argn >= argc) usage();
      comment_arg = argv[argn];
      /* If the comment text starts with '"', then we are probably running
       * under MS-DOG and must parse out the quoted string ourselves.  Sigh.
       */
      if (comment_arg[0] == '"') {
        comment_arg = (char *)malloc((size_t)MAX_COM_LENGTH);
        if (comment_arg == NULL)
          ERREXIT("Insufficient memory");
        if (strlen(argv[argn]) + 2 >= (size_t)MAX_COM_LENGTH) {
          fprintf(stderr, "Comment text may not exceed %u bytes\n",
                  (unsigned int)MAX_COM_LENGTH);
          exit(EXIT_FAILURE);
        }
        strcpy(comment_arg, argv[argn] + 1);
        for (;;) {
          comment_length = (unsigned int)strlen(comment_arg);
          if (comment_length > 0 && comment_arg[comment_length - 1] == '"') {
            comment_arg[comment_length - 1] = '\0'; /* zap terminating quote */
            break;
          }
          if (++argn >= argc)
            ERREXIT("Missing ending quote mark");
          if (strlen(comment_arg) + strlen(argv[argn]) + 2 >=
              (size_t)MAX_COM_LENGTH) {
            fprintf(stderr, "Comment text may not exceed %u bytes\n",
                    (unsigned int)MAX_COM_LENGTH);
            exit(EXIT_FAILURE);
          }
          strcat(comment_arg, " ");
          strcat(comment_arg, argv[argn]);
        }
      } else if (strlen(argv[argn]) >= (size_t)MAX_COM_LENGTH) {
        fprintf(stderr, "Comment text may not exceed %u bytes\n",
                (unsigned int)MAX_COM_LENGTH);
        exit(EXIT_FAILURE);
      }
      comment_length = (unsigned int)strlen(comment_arg);
    } else
      usage();
  }

  /* Cannot use both -comment and -cfile. */
  if (comment_arg != NULL && comment_file != NULL)
    usage();
  /* If there is neither -comment nor -cfile, we will read the comment text
   * from stdin; in this case there MUST be an input JPEG file name.
   */
  if (comment_arg == NULL && comment_file == NULL && argn >= argc)
    usage();

  /* Open the input file. */
  if (argn < argc) {
    if ((infile = fopen(argv[argn], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
#ifdef USE_SETMODE              /* need to hack file mode? */
    setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
    if ((infile = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open stdin\n", progname);
      exit(EXIT_FAILURE);
    }
#else
    infile = stdin;
#endif
  }

  /* Open the output file. */
#ifdef TWO_FILE_COMMANDLINE
  /* Must have explicit output file name */
  if (argn != argc - 2) {
    fprintf(stderr, "%s: must name one input and one output file\n", progname);
    usage();
  }
  if ((outfile = fopen(argv[argn + 1], WRITE_BINARY)) == NULL) {
    fprintf(stderr, "%s: can't open %s\n", progname, argv[argn + 1]);
    exit(EXIT_FAILURE);
  }
#else
  /* Unix style: expect zero or one file name */
  if (argn < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
  /* default output file is stdout */
#ifdef USE_SETMODE              /* need to hack file mode? */
  setmode(fileno(stdout), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
  if ((outfile = fdopen(fileno(stdout), WRITE_BINARY)) == NULL) {
    fprintf(stderr, "%s: can't open stdout\n", progname);
    exit(EXIT_FAILURE);
  }
#else
  outfile = stdout;
#endif
#endif /* TWO_FILE_COMMANDLINE */

  /* Collect comment text from comment_file or stdin, if necessary */
  if (comment_arg == NULL) {
    FILE *src_file;
    int c;

    comment_arg = (char *)malloc((size_t)MAX_COM_LENGTH);
    if (comment_arg == NULL)
      ERREXIT("Insufficient memory");
    comment_length = 0;
    src_file = (comment_file != NULL ? comment_file : stdin);
    while ((c = getc(src_file)) != EOF) {
      if (comment_length >= (unsigned int)MAX_COM_LENGTH) {
        fprintf(stderr, "Comment text may not exceed %u bytes\n",
                (unsigned int)MAX_COM_LENGTH);
        exit(EXIT_FAILURE);
      }
      comment_arg[comment_length++] = (char)c;
    }
    if (comment_file != NULL)
      fclose(comment_file);
  }

  /* Copy JPEG headers until SOFn marker;
   * we will insert the new comment marker just before SOFn.
   * This (a) causes the new comment to appear after, rather than before,
   * existing comments; and (b) ensures that comments come after any JFIF
   * or JFXX markers, as required by the JFIF specification.
   */
  marker = scan_JPEG_header(keep_COM);
  /* Insert the new COM marker, but only if nonempty text has been supplied */
  if (comment_length > 0) {
    write_marker(M_COM);
    write_2_bytes(comment_length + 2);
    while (comment_length > 0) {
      write_1_byte(*comment_arg++);
      comment_length--;
    }
  }
  /* Duplicate the remainder of the source file.
   * Note that any COM markers occurring after SOF will not be touched.
   */
  write_marker(marker);
  copy_rest_of_file();

  /* All done. */
  exit(EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}